

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

double __thiscall
despot::PocmanSmartParticleUpperBound::Value(PocmanSmartParticleUpperBound *this,State *state)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  PocmanState *pocstate;
  State *state_local;
  PocmanSmartParticleUpperBound *this_local;
  
  dVar1 = this->pocman_->reward_eat_food_;
  dVar2 = this->pocman_->reward_eat_ghost_;
  dVar4 = Globals::Discount(*(int *)(state + 0x80));
  dVar5 = Globals::Discount();
  dVar3 = this->pocman_->reward_clear_level_;
  dVar6 = Globals::Discount(*(int *)(state + 0x80));
  return dVar3 * dVar6 + ((dVar1 + dVar2) * (1.0 - dVar4)) / (1.0 - dVar5);
}

Assistant:

double Value(const State& state) const {
		const PocmanState& pocstate = static_cast<const PocmanState&>(state);
		return (pocman_->reward_eat_food_ + pocman_->reward_eat_ghost_)
			* (1 - Globals::Discount(pocstate.num_food)) / (1 - Globals::Discount())
			+ pocman_->reward_clear_level_ * Globals::Discount(pocstate.num_food);
	}